

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>::iterator,_bool>
* __thiscall
phmap::container_internal::
raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
::try_emplace_impl<unsigned_long_const&>
          (pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,unsigned_long *k)

{
  long lVar1;
  undefined1 auVar2 [16];
  size_t i;
  pair<unsigned_long,_bool> pVar3;
  tuple<> local_31;
  tuple<const_unsigned_long_&> local_30;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *k;
  pVar3 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find_or_prepare_insert<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)this,k,
                     SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                     SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0));
  i = pVar3.first;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_30.super__Tuple_impl<0UL,_const_unsigned_long_&>.
    super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_unsigned_long_&>)(_Tuple_impl<0UL,_const_unsigned_long_&>)k;
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
              ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                *)this,i,(piecewise_construct_t *)&std::piecewise_construct,&local_30,&local_31);
  }
  lVar1 = *(long *)((long)this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x18 + lVar1);
  __return_storage_ptr__->second = pVar3.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        auto res = this->find_or_prepare_insert(k);
        if (res.second)
            this->emplace_at(res.first, std::piecewise_construct,
                             std::forward_as_tuple(std::forward<K>(k)),
                             std::forward_as_tuple(std::forward<Args>(args)...));
        return {this->iterator_at(res.first), res.second};
    }